

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O1

int Abc_TtCofactorPermNaive(word *pTruth,int i,int nWords,int fSwapOnly)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  word wVar4;
  long lVar5;
  uint *pLimitU;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  word *pwVar13;
  ulong uVar14;
  ulong uVar15;
  word *pwVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  word *pwVar20;
  ulong uVar21;
  bool bVar22;
  
  bVar6 = (byte)i;
  if (fSwapOnly != 0) {
    uVar14 = (ulong)(uint)nWords;
    if (0 < nWords) {
      lVar12 = 0;
      do {
        *(undefined8 *)((long)Abc_TtCofactorPermNaive::pCopy + lVar12) =
             *(undefined8 *)((long)pTruth + lVar12);
        lVar12 = lVar12 + 8;
      } while (uVar14 * 8 - lVar12 != 0);
    }
    uVar19 = uVar14;
    if (i < 5) {
      if (0 < nWords) {
        uVar15 = s_PMasks[i][0];
        uVar21 = s_PMasks[i][1];
        uVar2 = s_PMasks[i][2];
        lVar12 = 0;
        do {
          uVar3 = *(ulong *)((long)Abc_TtCofactorPermNaive::pCopy + lVar12);
          bVar7 = (byte)(1 << (bVar6 & 0x1f));
          *(ulong *)((long)Abc_TtCofactorPermNaive::pCopy + lVar12) =
               (uVar3 & uVar2) >> (bVar7 & 0x3f) |
               (uVar3 & uVar21) << (bVar7 & 0x3f) | uVar3 & uVar15;
          lVar12 = lVar12 + 8;
        } while (uVar14 * 8 - lVar12 != 0);
      }
    }
    else {
      pwVar13 = Abc_TtCofactorPermNaive::pCopy;
      if (i == 5) {
        if (0 < nWords) {
          pwVar13 = Abc_TtCofactorPermNaive::pCopy;
          do {
            puVar1 = (ulong *)((long)pwVar13 + 4);
            *puVar1 = *puVar1 << 0x20 | *puVar1 >> 0x20;
            pwVar13 = pwVar13 + 2;
          } while (pwVar13 < Abc_TtCofactorPermNaive::pCopy + nWords);
        }
      }
      else if (0 < nWords) {
        uVar15 = (ulong)(uint)(1 << (bVar6 - 6 & 0x1f));
        if (i < 7) {
          uVar15 = 1;
        }
        iVar10 = (int)uVar15;
        iVar9 = iVar10 * 4;
        pwVar16 = Abc_TtCofactorPermNaive::pCopy + (uint)(iVar10 * 2);
        pwVar20 = Abc_TtCofactorPermNaive::pCopy + uVar15;
        do {
          if (0 < iVar10) {
            uVar21 = 0;
            do {
              wVar4 = pwVar20[uVar21];
              pwVar20[uVar21] = pwVar16[uVar21];
              pwVar16[uVar21] = wVar4;
              uVar21 = uVar21 + 1;
            } while (uVar15 != uVar21);
          }
          pwVar13 = pwVar13 + iVar9;
          pwVar16 = pwVar16 + iVar9;
          pwVar20 = pwVar20 + iVar9;
        } while (pwVar13 < Abc_TtCofactorPermNaive::pCopy + nWords);
      }
    }
    do {
      if ((int)uVar19 < 1) {
        bVar22 = true;
        break;
      }
      lVar5 = uVar19 + 0x3ff;
      lVar12 = uVar19 - 1;
      bVar22 = pTruth[lVar12] < Abc_TtCofactorTest10::pCopy2[lVar5];
      uVar19 = uVar19 - 1;
    } while (pTruth[lVar12] == Abc_TtCofactorTest10::pCopy2[lVar5]);
    iVar10 = (uint)(bVar22 ^ 1) << 2;
    if (nWords < 1) {
      return iVar10;
    }
    if (bVar22 != false) {
      return iVar10;
    }
    lVar12 = 0;
    do {
      *(undefined8 *)((long)pTruth + lVar12) =
           *(undefined8 *)((long)Abc_TtCofactorPermNaive::pCopy + lVar12);
      lVar12 = lVar12 + 8;
    } while (uVar14 << 3 != lVar12);
    return 4;
  }
  if (0 < nWords) {
    lVar12 = 0;
    do {
      *(undefined8 *)((long)Abc_TtCofactorPermNaive::pCopy_1 + lVar12) =
           *(undefined8 *)((long)pTruth + lVar12);
      lVar12 = lVar12 + 8;
    } while ((ulong)(uint)nWords * 8 - lVar12 != 0);
    if (0 < nWords) {
      lVar12 = 0;
      do {
        *(undefined8 *)((long)Abc_TtCofactorPermNaive::pBest + lVar12) =
             *(undefined8 *)((long)pTruth + lVar12);
        lVar12 = lVar12 + 8;
      } while ((ulong)(uint)nWords << 3 != lVar12);
    }
  }
  if (nWords == 1) {
    bVar7 = (byte)(1 << (bVar6 & 0x1f));
    Abc_TtCofactorPermNaive::pCopy_1[0] =
         (s_Truths6[i] & Abc_TtCofactorPermNaive::pCopy_1[0]) >> (bVar7 & 0x3f) |
         Abc_TtCofactorPermNaive::pCopy_1[0] << (bVar7 & 0x3f) & s_Truths6[i];
  }
  else if (i < 6) {
    if (0 < nWords) {
      uVar14 = s_Truths6[i];
      lVar12 = 0;
      do {
        bVar7 = (byte)(1 << (bVar6 & 0x1f));
        *(ulong *)((long)Abc_TtCofactorPermNaive::pCopy_1 + lVar12) =
             (*(ulong *)((long)Abc_TtCofactorPermNaive::pCopy_1 + lVar12) & uVar14) >>
             (bVar7 & 0x3f) |
             *(ulong *)((long)Abc_TtCofactorPermNaive::pCopy_1 + lVar12) << (bVar7 & 0x3f) & uVar14;
        lVar12 = lVar12 + 8;
      } while ((ulong)(uint)nWords << 3 != lVar12);
    }
  }
  else if (0 < nWords) {
    pwVar13 = Abc_TtCofactorPermNaive::pCopy_1;
    bVar7 = (byte)(i + -6);
    uVar18 = 1 << (bVar7 & 0x1f);
    iVar10 = 2 << (bVar7 & 0x1f);
    uVar14 = 1;
    if (1 < (int)uVar18) {
      uVar14 = (ulong)uVar18;
    }
    pwVar16 = Abc_TtCofactorPermNaive::pCopy_1 + (int)uVar18;
    do {
      if (i + -6 != 0x1f) {
        uVar19 = 0;
        do {
          wVar4 = pwVar13[uVar19];
          pwVar13[uVar19] = pwVar16[uVar19];
          pwVar16[uVar19] = wVar4;
          uVar19 = uVar19 + 1;
        } while (uVar14 != uVar19);
      }
      pwVar13 = pwVar13 + iVar10;
      pwVar16 = pwVar16 + iVar10;
    } while (pwVar13 < Abc_TtCofactorPermNaive::pCopy_1 + nWords);
  }
  uVar19 = (ulong)(uint)nWords;
  pwVar13 = Abc_TtCofactorPermNaive::pCopy_1;
  uVar14 = uVar19;
  do {
    if ((int)uVar14 < 1) {
      bVar22 = true;
      break;
    }
    lVar12 = uVar14 + 0x3ff;
    lVar5 = uVar14 + 0x3ff;
    bVar22 = Abc_TtCofactorPermNaive::pCopy_1[lVar5] < Abc_TtCofactorPermNaive::pCopy[lVar12];
    uVar14 = uVar14 - 1;
  } while (Abc_TtCofactorPermNaive::pCopy_1[lVar5] == Abc_TtCofactorPermNaive::pCopy[lVar12]);
  uVar18 = (uint)(bVar22 ^ 1U);
  if ((0 < nWords) && (uVar18 = (uint)(bVar22 ^ 1U), bVar22 == false)) {
    memcpy(Abc_TtCofactorPermNaive::pBest,Abc_TtCofactorPermNaive::pCopy_1,uVar19 * 8);
    uVar18 = 1;
  }
  iVar10 = i + 1;
  bVar7 = (byte)iVar10;
  if (nWords == 1) {
    bVar8 = (byte)(1 << (bVar7 & 0x1f));
    Abc_TtCofactorPermNaive::pCopy_1[0] =
         (s_Truths6[iVar10] & Abc_TtCofactorPermNaive::pCopy_1[0]) >> (bVar8 & 0x3f) |
         Abc_TtCofactorPermNaive::pCopy_1[0] << (bVar8 & 0x3f) & s_Truths6[iVar10];
  }
  else if (i < 5) {
    if (0 < nWords) {
      uVar14 = s_Truths6[iVar10];
      lVar12 = 0;
      do {
        bVar8 = (byte)(1 << (bVar7 & 0x1f));
        *(ulong *)((long)Abc_TtCofactorPermNaive::pCopy_1 + lVar12) =
             (*(ulong *)((long)Abc_TtCofactorPermNaive::pCopy_1 + lVar12) & uVar14) >>
             (bVar8 & 0x3f) |
             *(ulong *)((long)Abc_TtCofactorPermNaive::pCopy_1 + lVar12) << (bVar8 & 0x3f) & uVar14;
        lVar12 = lVar12 + 8;
      } while (uVar19 * 8 - lVar12 != 0);
    }
  }
  else if (0 < nWords) {
    bVar8 = (byte)(i + -5);
    uVar17 = 1 << (bVar8 & 0x1f);
    iVar9 = 2 << (bVar8 & 0x1f);
    uVar14 = 1;
    if (1 < (int)uVar17) {
      uVar14 = (ulong)uVar17;
    }
    pwVar16 = Abc_TtCofactorPermNaive::pCopy_1 + (int)uVar17;
    do {
      if (i + -5 != 0x1f) {
        uVar15 = 0;
        do {
          wVar4 = pwVar13[uVar15];
          pwVar13[uVar15] = pwVar16[uVar15];
          pwVar16[uVar15] = wVar4;
          uVar15 = uVar15 + 1;
        } while (uVar14 != uVar15);
      }
      pwVar13 = pwVar13 + iVar9;
      pwVar16 = pwVar16 + iVar9;
    } while (pwVar13 < Abc_TtCofactorPermNaive::pCopy_1 + nWords);
  }
  pwVar13 = Abc_TtCofactorPermNaive::pCopy_1;
  uVar14 = uVar19;
  do {
    if ((int)uVar14 < 1) {
      bVar22 = true;
      break;
    }
    lVar12 = uVar14 + 0x3ff;
    lVar5 = uVar14 + 0x3ff;
    bVar22 = Abc_TtCofactorPermNaive::pCopy_1[lVar5] < Abc_TtCofactorPermNaive::pCopy[lVar12];
    uVar14 = uVar14 - 1;
  } while (Abc_TtCofactorPermNaive::pCopy_1[lVar5] == Abc_TtCofactorPermNaive::pCopy[lVar12]);
  uVar17 = 3;
  if (bVar22) {
    uVar17 = uVar18;
  }
  if ((0 < nWords) && (!bVar22)) {
    memcpy(Abc_TtCofactorPermNaive::pBest,Abc_TtCofactorPermNaive::pCopy_1,uVar19 * 8);
    uVar17 = 3;
  }
  if (nWords == 1) {
    bVar8 = (byte)(1 << (bVar6 & 0x1f));
    Abc_TtCofactorPermNaive::pCopy_1[0] =
         (s_Truths6[i] & Abc_TtCofactorPermNaive::pCopy_1[0]) >> (bVar8 & 0x3f) |
         Abc_TtCofactorPermNaive::pCopy_1[0] << (bVar8 & 0x3f) & s_Truths6[i];
  }
  else if (i < 6) {
    if (0 < nWords) {
      uVar14 = s_Truths6[i];
      lVar12 = 0;
      do {
        bVar8 = (byte)(1 << (bVar6 & 0x1f));
        *(ulong *)((long)Abc_TtCofactorPermNaive::pCopy_1 + lVar12) =
             (*(ulong *)((long)Abc_TtCofactorPermNaive::pCopy_1 + lVar12) & uVar14) >>
             (bVar8 & 0x3f) |
             *(ulong *)((long)Abc_TtCofactorPermNaive::pCopy_1 + lVar12) << (bVar8 & 0x3f) & uVar14;
        lVar12 = lVar12 + 8;
      } while (uVar19 * 8 - lVar12 != 0);
    }
  }
  else if (0 < nWords) {
    bVar8 = (byte)(i + -6);
    uVar18 = 1 << (bVar8 & 0x1f);
    iVar9 = 2 << (bVar8 & 0x1f);
    uVar14 = 1;
    if (1 < (int)uVar18) {
      uVar14 = (ulong)uVar18;
    }
    pwVar16 = Abc_TtCofactorPermNaive::pCopy_1 + (int)uVar18;
    do {
      if (i + -6 != 0x1f) {
        uVar15 = 0;
        do {
          wVar4 = pwVar13[uVar15];
          pwVar13[uVar15] = pwVar16[uVar15];
          pwVar16[uVar15] = wVar4;
          uVar15 = uVar15 + 1;
        } while (uVar14 != uVar15);
      }
      pwVar13 = pwVar13 + iVar9;
      pwVar16 = pwVar16 + iVar9;
    } while (pwVar13 < Abc_TtCofactorPermNaive::pCopy_1 + nWords);
  }
  pwVar13 = Abc_TtCofactorPermNaive::pCopy_1;
  uVar14 = uVar19;
  do {
    if ((int)uVar14 < 1) {
      bVar22 = true;
      break;
    }
    lVar12 = uVar14 + 0x3ff;
    lVar5 = uVar14 + 0x3ff;
    bVar22 = Abc_TtCofactorPermNaive::pCopy_1[lVar5] < Abc_TtCofactorPermNaive::pCopy[lVar12];
    uVar14 = uVar14 - 1;
  } while (Abc_TtCofactorPermNaive::pCopy_1[lVar5] == Abc_TtCofactorPermNaive::pCopy[lVar12]);
  uVar18 = 2;
  if (bVar22) {
    uVar18 = uVar17;
  }
  if ((0 < nWords) && (!bVar22)) {
    memcpy(Abc_TtCofactorPermNaive::pBest,Abc_TtCofactorPermNaive::pCopy_1,uVar19 * 8);
    uVar18 = 2;
  }
  if (i < 5) {
    if (0 < nWords) {
      uVar14 = s_PMasks[i][0];
      uVar15 = s_PMasks[i][1];
      uVar21 = s_PMasks[i][2];
      lVar12 = 0;
      do {
        uVar2 = *(ulong *)((long)Abc_TtCofactorPermNaive::pCopy_1 + lVar12);
        bVar8 = (byte)(1 << (bVar6 & 0x1f));
        *(ulong *)((long)Abc_TtCofactorPermNaive::pCopy_1 + lVar12) =
             (uVar2 & uVar21) >> (bVar8 & 0x3f) |
             (uVar2 & uVar15) << (bVar8 & 0x3f) | uVar2 & uVar14;
        lVar12 = lVar12 + 8;
      } while (uVar19 * 8 - lVar12 != 0);
    }
  }
  else if (i == 5) {
    if (0 < nWords) {
      pwVar13 = Abc_TtCofactorPermNaive::pCopy_1;
      do {
        puVar1 = (ulong *)((long)pwVar13 + 4);
        *puVar1 = *puVar1 << 0x20 | *puVar1 >> 0x20;
        pwVar13 = pwVar13 + 2;
      } while (pwVar13 < Abc_TtCofactorPermNaive::pCopy_1 + nWords);
    }
  }
  else if (0 < nWords) {
    uVar14 = (ulong)(uint)(1 << (bVar6 - 6 & 0x1f));
    if (i < 7) {
      uVar14 = 1;
    }
    iVar9 = (int)uVar14;
    iVar11 = iVar9 * 4;
    pwVar16 = Abc_TtCofactorPermNaive::pCopy_1 + (uint)(iVar9 * 2);
    pwVar20 = Abc_TtCofactorPermNaive::pCopy_1 + uVar14;
    do {
      if (0 < iVar9) {
        uVar15 = 0;
        do {
          wVar4 = pwVar20[uVar15];
          pwVar20[uVar15] = pwVar16[uVar15];
          pwVar16[uVar15] = wVar4;
          uVar15 = uVar15 + 1;
        } while (uVar14 != uVar15);
      }
      pwVar13 = pwVar13 + iVar11;
      pwVar16 = pwVar16 + iVar11;
      pwVar20 = pwVar20 + iVar11;
    } while (pwVar13 < Abc_TtCofactorPermNaive::pCopy_1 + nWords);
  }
  pwVar13 = Abc_TtCofactorPermNaive::pCopy_1;
  uVar14 = uVar19;
  do {
    if ((int)uVar14 < 1) {
      bVar22 = true;
      break;
    }
    lVar12 = uVar14 + 0x3ff;
    lVar5 = uVar14 + 0x3ff;
    bVar22 = Abc_TtCofactorPermNaive::pCopy_1[lVar5] < Abc_TtCofactorPermNaive::pCopy[lVar12];
    uVar14 = uVar14 - 1;
  } while (Abc_TtCofactorPermNaive::pCopy_1[lVar5] == Abc_TtCofactorPermNaive::pCopy[lVar12]);
  uVar17 = 6;
  if (bVar22) {
    uVar17 = uVar18;
  }
  if ((0 < nWords) && (!bVar22)) {
    memcpy(Abc_TtCofactorPermNaive::pBest,Abc_TtCofactorPermNaive::pCopy_1,uVar19 * 8);
    uVar17 = 6;
  }
  if (nWords == 1) {
    bVar8 = (byte)(1 << (bVar7 & 0x1f));
    Abc_TtCofactorPermNaive::pCopy_1[0] =
         (s_Truths6[iVar10] & Abc_TtCofactorPermNaive::pCopy_1[0]) >> (bVar8 & 0x3f) |
         Abc_TtCofactorPermNaive::pCopy_1[0] << (bVar8 & 0x3f) & s_Truths6[iVar10];
  }
  else if (i < 5) {
    if (0 < nWords) {
      uVar14 = s_Truths6[iVar10];
      lVar12 = 0;
      do {
        bVar8 = (byte)(1 << (bVar7 & 0x1f));
        *(ulong *)((long)Abc_TtCofactorPermNaive::pCopy_1 + lVar12) =
             (*(ulong *)((long)Abc_TtCofactorPermNaive::pCopy_1 + lVar12) & uVar14) >>
             (bVar8 & 0x3f) |
             *(ulong *)((long)Abc_TtCofactorPermNaive::pCopy_1 + lVar12) << (bVar8 & 0x3f) & uVar14;
        lVar12 = lVar12 + 8;
      } while (uVar19 * 8 - lVar12 != 0);
    }
  }
  else if (0 < nWords) {
    bVar8 = (byte)(i + -5);
    uVar18 = 1 << (bVar8 & 0x1f);
    iVar9 = 2 << (bVar8 & 0x1f);
    uVar14 = 1;
    if (1 < (int)uVar18) {
      uVar14 = (ulong)uVar18;
    }
    pwVar16 = Abc_TtCofactorPermNaive::pCopy_1 + (int)uVar18;
    do {
      if (i + -5 != 0x1f) {
        uVar15 = 0;
        do {
          wVar4 = pwVar13[uVar15];
          pwVar13[uVar15] = pwVar16[uVar15];
          pwVar16[uVar15] = wVar4;
          uVar15 = uVar15 + 1;
        } while (uVar14 != uVar15);
      }
      pwVar13 = pwVar13 + iVar9;
      pwVar16 = pwVar16 + iVar9;
    } while (pwVar13 < Abc_TtCofactorPermNaive::pCopy_1 + nWords);
  }
  pwVar13 = Abc_TtCofactorPermNaive::pCopy_1;
  uVar14 = uVar19;
  do {
    if ((int)uVar14 < 1) {
      bVar22 = true;
      break;
    }
    lVar12 = uVar14 + 0x3ff;
    lVar5 = uVar14 + 0x3ff;
    bVar22 = Abc_TtCofactorPermNaive::pCopy_1[lVar5] < Abc_TtCofactorPermNaive::pCopy[lVar12];
    uVar14 = uVar14 - 1;
  } while (Abc_TtCofactorPermNaive::pCopy_1[lVar5] == Abc_TtCofactorPermNaive::pCopy[lVar12]);
  uVar18 = 7;
  if (bVar22) {
    uVar18 = uVar17;
  }
  if ((0 < nWords) && (!bVar22)) {
    memcpy(Abc_TtCofactorPermNaive::pBest,Abc_TtCofactorPermNaive::pCopy_1,uVar19 * 8);
    uVar18 = 7;
  }
  if (nWords == 1) {
    bVar8 = (byte)(1 << (bVar6 & 0x1f));
    Abc_TtCofactorPermNaive::pCopy_1[0] =
         (s_Truths6[i] & Abc_TtCofactorPermNaive::pCopy_1[0]) >> (bVar8 & 0x3f) |
         Abc_TtCofactorPermNaive::pCopy_1[0] << (bVar8 & 0x3f) & s_Truths6[i];
  }
  else if (i < 6) {
    if (0 < nWords) {
      uVar14 = s_Truths6[i];
      lVar12 = 0;
      do {
        bVar8 = (byte)(1 << (bVar6 & 0x1f));
        *(ulong *)((long)Abc_TtCofactorPermNaive::pCopy_1 + lVar12) =
             (*(ulong *)((long)Abc_TtCofactorPermNaive::pCopy_1 + lVar12) & uVar14) >>
             (bVar8 & 0x3f) |
             *(ulong *)((long)Abc_TtCofactorPermNaive::pCopy_1 + lVar12) << (bVar8 & 0x3f) & uVar14;
        lVar12 = lVar12 + 8;
      } while (uVar19 * 8 - lVar12 != 0);
    }
  }
  else if (0 < nWords) {
    bVar8 = (byte)(i + -6);
    uVar17 = 1 << (bVar8 & 0x1f);
    iVar9 = 2 << (bVar8 & 0x1f);
    uVar14 = 1;
    if (1 < (int)uVar17) {
      uVar14 = (ulong)uVar17;
    }
    pwVar16 = Abc_TtCofactorPermNaive::pCopy_1 + (int)uVar17;
    do {
      if (i + -6 != 0x1f) {
        uVar15 = 0;
        do {
          wVar4 = pwVar13[uVar15];
          pwVar13[uVar15] = pwVar16[uVar15];
          pwVar16[uVar15] = wVar4;
          uVar15 = uVar15 + 1;
        } while (uVar14 != uVar15);
      }
      pwVar13 = pwVar13 + iVar9;
      pwVar16 = pwVar16 + iVar9;
    } while (pwVar13 < Abc_TtCofactorPermNaive::pCopy_1 + nWords);
  }
  pwVar13 = Abc_TtCofactorPermNaive::pCopy_1;
  uVar14 = uVar19;
  do {
    if ((int)uVar14 < 1) {
      bVar22 = true;
      break;
    }
    lVar12 = uVar14 + 0x3ff;
    lVar5 = uVar14 + 0x3ff;
    bVar22 = Abc_TtCofactorPermNaive::pCopy_1[lVar5] < Abc_TtCofactorPermNaive::pCopy[lVar12];
    uVar14 = uVar14 - 1;
  } while (Abc_TtCofactorPermNaive::pCopy_1[lVar5] == Abc_TtCofactorPermNaive::pCopy[lVar12]);
  uVar17 = 5;
  if (bVar22) {
    uVar17 = uVar18;
  }
  if ((0 < nWords) && (!bVar22)) {
    memcpy(Abc_TtCofactorPermNaive::pBest,Abc_TtCofactorPermNaive::pCopy_1,uVar19 * 8);
    uVar17 = 5;
  }
  if (nWords == 1) {
    bVar7 = (byte)(1 << (bVar7 & 0x1f));
    Abc_TtCofactorPermNaive::pCopy_1[0] =
         (s_Truths6[iVar10] & Abc_TtCofactorPermNaive::pCopy_1[0]) >> (bVar7 & 0x3f) |
         Abc_TtCofactorPermNaive::pCopy_1[0] << (bVar7 & 0x3f) & s_Truths6[iVar10];
  }
  else if (i < 5) {
    if (0 < nWords) {
      uVar14 = s_Truths6[iVar10];
      lVar12 = 0;
      do {
        bVar8 = (byte)(1 << (bVar7 & 0x1f));
        *(ulong *)((long)Abc_TtCofactorPermNaive::pCopy_1 + lVar12) =
             (*(ulong *)((long)Abc_TtCofactorPermNaive::pCopy_1 + lVar12) & uVar14) >>
             (bVar8 & 0x3f) |
             *(ulong *)((long)Abc_TtCofactorPermNaive::pCopy_1 + lVar12) << (bVar8 & 0x3f) & uVar14;
        lVar12 = lVar12 + 8;
      } while (uVar19 * 8 - lVar12 != 0);
    }
  }
  else if (0 < nWords) {
    bVar7 = (byte)(i + -5);
    uVar18 = 1 << (bVar7 & 0x1f);
    iVar10 = 2 << (bVar7 & 0x1f);
    uVar14 = 1;
    if (1 < (int)uVar18) {
      uVar14 = (ulong)uVar18;
    }
    pwVar16 = Abc_TtCofactorPermNaive::pCopy_1 + (int)uVar18;
    do {
      if (i + -5 != 0x1f) {
        uVar15 = 0;
        do {
          wVar4 = pwVar13[uVar15];
          pwVar13[uVar15] = pwVar16[uVar15];
          pwVar16[uVar15] = wVar4;
          uVar15 = uVar15 + 1;
        } while (uVar14 != uVar15);
      }
      pwVar13 = pwVar13 + iVar10;
      pwVar16 = pwVar16 + iVar10;
    } while (pwVar13 < Abc_TtCofactorPermNaive::pCopy_1 + nWords);
  }
  pwVar13 = Abc_TtCofactorPermNaive::pCopy_1;
  uVar14 = uVar19;
  do {
    if ((int)uVar14 < 1) {
      bVar22 = true;
      break;
    }
    lVar12 = uVar14 + 0x3ff;
    lVar5 = uVar14 + 0x3ff;
    bVar22 = Abc_TtCofactorPermNaive::pCopy_1[lVar5] < Abc_TtCofactorPermNaive::pCopy[lVar12];
    uVar14 = uVar14 - 1;
  } while (Abc_TtCofactorPermNaive::pCopy_1[lVar5] == Abc_TtCofactorPermNaive::pCopy[lVar12]);
  uVar18 = 4;
  if (bVar22) {
    uVar18 = uVar17;
  }
  if ((0 < nWords) && (!bVar22)) {
    memcpy(Abc_TtCofactorPermNaive::pBest,Abc_TtCofactorPermNaive::pCopy_1,uVar19 * 8);
    uVar18 = 4;
  }
  if (i < 5) {
    if (nWords < 1) goto LAB_004fc490;
    uVar14 = s_PMasks[i][0];
    uVar15 = s_PMasks[i][1];
    uVar21 = s_PMasks[i][2];
    lVar12 = 0;
    do {
      uVar2 = *(ulong *)((long)Abc_TtCofactorPermNaive::pCopy_1 + lVar12);
      bVar7 = (byte)(1 << (bVar6 & 0x1f));
      *(ulong *)((long)Abc_TtCofactorPermNaive::pCopy_1 + lVar12) =
           (uVar2 & uVar21) >> (bVar7 & 0x3f) | (uVar2 & uVar15) << (bVar7 & 0x3f) | uVar2 & uVar14;
      lVar12 = lVar12 + 8;
    } while (uVar19 * 8 - lVar12 != 0);
  }
  else if (i == 5) {
    if (nWords < 1) goto LAB_004fc490;
    pwVar13 = Abc_TtCofactorPermNaive::pCopy_1;
    do {
      puVar1 = (ulong *)((long)pwVar13 + 4);
      *puVar1 = *puVar1 << 0x20 | *puVar1 >> 0x20;
      pwVar13 = pwVar13 + 2;
    } while (pwVar13 < Abc_TtCofactorPermNaive::pCopy_1 + nWords);
  }
  else {
    if (nWords < 1) goto LAB_004fc490;
    uVar14 = (ulong)(uint)(1 << (bVar6 - 6 & 0x1f));
    if (i < 7) {
      uVar14 = 1;
    }
    iVar10 = (int)uVar14;
    iVar9 = iVar10 * 4;
    pwVar16 = Abc_TtCofactorPermNaive::pCopy_1 + (uint)(iVar10 * 2);
    pwVar20 = Abc_TtCofactorPermNaive::pCopy_1 + uVar14;
    do {
      if (0 < iVar10) {
        uVar15 = 0;
        do {
          wVar4 = pwVar20[uVar15];
          pwVar20[uVar15] = pwVar16[uVar15];
          pwVar16[uVar15] = wVar4;
          uVar15 = uVar15 + 1;
        } while (uVar14 != uVar15);
      }
      pwVar13 = pwVar13 + iVar9;
      pwVar16 = pwVar16 + iVar9;
      pwVar20 = pwVar20 + iVar9;
    } while (pwVar13 < Abc_TtCofactorPermNaive::pCopy_1 + nWords);
  }
  if (0 < nWords) {
    lVar12 = 0;
    do {
      if (*(long *)((long)pTruth + lVar12) !=
          *(long *)((long)Abc_TtCofactorPermNaive::pCopy_1 + lVar12)) {
        __assert_fail("Abc_TtEqual( pTruth, pCopy, nWords )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauCanon.c"
                      ,0x356,"int Abc_TtCofactorPermNaive(word *, int, int, int)");
      }
      lVar12 = lVar12 + 8;
    } while (uVar19 * 8 - lVar12 != 0);
  }
LAB_004fc490:
  uVar14 = uVar19;
  if (uVar18 == 0) {
    uVar18 = 0;
  }
  else {
    do {
      if ((int)uVar14 < 1) goto LAB_004fc4de;
      lVar5 = uVar14 + 0x3ff;
      lVar12 = uVar14 - 1;
      uVar14 = uVar14 - 1;
    } while (pTruth[lVar12] == Abc_TtCofactorPermNaive::pCopy_1[lVar5]);
    if (pTruth[lVar12] < Abc_TtCofactorPermNaive::pCopy_1[lVar5]) {
LAB_004fc4de:
      __assert_fail("Abc_TtCompareRev(pTruth, pBest, nWords) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauCanon.c"
                    ,0x359,"int Abc_TtCofactorPermNaive(word *, int, int, int)");
    }
    if (0 < nWords) {
      lVar12 = 0;
      do {
        *(undefined8 *)((long)pTruth + lVar12) =
             *(undefined8 *)((long)Abc_TtCofactorPermNaive::pBest + lVar12);
        lVar12 = lVar12 + 8;
      } while (uVar19 << 3 != lVar12);
    }
  }
  return uVar18;
}

Assistant:

int Abc_TtCofactorPermNaive( word * pTruth, int i, int nWords, int fSwapOnly )
{
    if ( fSwapOnly )
    {
        static word pCopy[1024];
        Abc_TtCopy( pCopy, pTruth, nWords, 0 );
        Abc_TtSwapAdjacent( pCopy, nWords, i );
        if ( Abc_TtCompareRev(pTruth, pCopy, nWords) == 1 )
        {
            Abc_TtCopy( pTruth, pCopy, nWords, 0 );
            return 4;
        }
        return 0;
    }
    {
        static word pCopy[1024];
        static word pBest[1024];
        int Config = 0;
        // save two copies
        Abc_TtCopy( pCopy, pTruth, nWords, 0 );
        Abc_TtCopy( pBest, pTruth, nWords, 0 );
        // PXY
        // 001
        Abc_TtFlip( pCopy, nWords, i );
        if ( Abc_TtCompareRev(pBest, pCopy, nWords) == 1 )
            Abc_TtCopy( pBest, pCopy, nWords, 0 ), Config = 1;
        // PXY
        // 011
        Abc_TtFlip( pCopy, nWords, i+1 );
        if ( Abc_TtCompareRev(pBest, pCopy, nWords) == 1 )
            Abc_TtCopy( pBest, pCopy, nWords, 0 ), Config = 3;
        // PXY
        // 010
        Abc_TtFlip( pCopy, nWords, i );
        if ( Abc_TtCompareRev(pBest, pCopy, nWords) == 1 )
            Abc_TtCopy( pBest, pCopy, nWords, 0 ), Config = 2;
        // PXY
        // 110
        Abc_TtSwapAdjacent( pCopy, nWords, i );
        if ( Abc_TtCompareRev(pBest, pCopy, nWords) == 1 )
            Abc_TtCopy( pBest, pCopy, nWords, 0 ), Config = 6;
        // PXY
        // 111
        Abc_TtFlip( pCopy, nWords, i+1 );
        if ( Abc_TtCompareRev(pBest, pCopy, nWords) == 1 )
            Abc_TtCopy( pBest, pCopy, nWords, 0 ), Config = 7;
        // PXY
        // 101
        Abc_TtFlip( pCopy, nWords, i );
        if ( Abc_TtCompareRev(pBest, pCopy, nWords) == 1 )
            Abc_TtCopy( pBest, pCopy, nWords, 0 ), Config = 5;
        // PXY
        // 100
        Abc_TtFlip( pCopy, nWords, i+1 );
        if ( Abc_TtCompareRev(pBest, pCopy, nWords) == 1 )
            Abc_TtCopy( pBest, pCopy, nWords, 0 ), Config = 4;
        // PXY
        // 000
        Abc_TtSwapAdjacent( pCopy, nWords, i );
        assert( Abc_TtEqual( pTruth, pCopy, nWords ) );
        if ( Config == 0 )
            return 0;
        assert( Abc_TtCompareRev(pTruth, pBest, nWords) == 1 );
        Abc_TtCopy( pTruth, pBest, nWords, 0 );
        return Config;
    }
}